

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O0

bool __thiscall ftxui::TabContainer::OnMouseEvent(TabContainer *this,Event *event)

{
  int iVar1;
  element_type *peVar2;
  Event local_68;
  shared_ptr<ftxui::ComponentBase> local_28;
  Event *local_18;
  Event *event_local;
  TabContainer *this_local;
  
  local_18 = event;
  event_local = (Event *)this;
  (*(this->super_ContainerBase).super_ComponentBase._vptr_ComponentBase[4])();
  peVar2 = std::__shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_28);
  Event::Event(&local_68,event);
  iVar1 = (*peVar2->_vptr_ComponentBase[3])(peVar2,&local_68);
  Event::~Event(&local_68);
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(&local_28);
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool OnMouseEvent(Event event) override {
    return ActiveChild()->OnEvent(event);
  }